

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_paeth_predictor_8x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  ushort uVar9;
  undefined1 auVar10 [15];
  unkuint9 Var11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [13];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [16];
  long lVar17;
  int iVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  short sVar21;
  short sVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  short sVar29;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  undefined1 auVar30 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar26;
  
  auVar16 = _DAT_004d47a0;
  uVar1 = *(ulong *)above;
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xe] = (char)(uVar1 >> 0x38);
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xc] = (char)(uVar1 >> 0x30);
  auVar4._13_2_ = auVar3._13_2_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5._12_3_ = auVar4._12_3_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[10] = (char)(uVar1 >> 0x28);
  auVar6._11_4_ = auVar5._11_4_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7._10_5_ = auVar6._10_5_;
  auVar8[8] = (char)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._9_6_ = auVar7._9_6_;
  auVar10._7_8_ = 0;
  auVar10._0_7_ = auVar8._8_7_;
  Var11 = CONCAT81(SUB158(auVar10 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar14._9_6_ = 0;
  auVar14._0_9_ = Var11;
  auVar12._1_10_ = SUB1510(auVar14 << 0x30,5);
  auVar12[0] = (char)(uVar1 >> 0x10);
  auVar15._11_4_ = 0;
  auVar15._0_11_ = auVar12;
  auVar13._1_12_ = SUB1512(auVar15 << 0x20,3);
  auVar13[0] = (char)(uVar1 >> 8);
  auVar20._0_2_ = CONCAT11(0,(byte)uVar1);
  auVar20._2_13_ = auVar13;
  auVar20[0xf] = 0;
  auVar22 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar23._0_4_ = auVar22._0_4_;
  auVar23._4_4_ = auVar23._0_4_;
  auVar23._8_4_ = auVar23._0_4_;
  auVar23._12_4_ = auVar23._0_4_;
  sVar21 = auVar22._0_2_;
  auVar25._0_2_ = auVar20._0_2_ - sVar21;
  sVar24 = auVar22._2_2_;
  auVar25._2_2_ = auVar13._0_2_ - sVar24;
  auVar25._4_2_ = auVar12._0_2_ - sVar21;
  sVar26 = (short)Var11;
  auVar25._6_2_ = sVar26 - sVar24;
  auVar25._8_2_ = auVar8._8_2_ - sVar21;
  auVar25._10_2_ = auVar6._10_2_ - sVar24;
  uVar9 = auVar3._13_2_ >> 8;
  auVar25._12_2_ = auVar4._12_2_ - sVar21;
  auVar25._14_2_ = uVar9 - sVar24;
  auVar22 = pabsw(in_XMM3,auVar25);
  lVar17 = 0;
  do {
    auVar2 = *(undefined1 (*) [16])(left + lVar17 * 0x10);
    iVar18 = 0x10;
    auVar27 = auVar16;
    do {
      auVar28 = pshufb(auVar2,auVar27);
      sVar29 = auVar25._0_2_ + auVar28._0_2_;
      sVar31 = auVar25._2_2_ + auVar28._2_2_;
      sVar32 = auVar25._4_2_ + auVar28._4_2_;
      sVar33 = auVar25._6_2_ + auVar28._6_2_;
      sVar34 = auVar25._8_2_ + auVar28._8_2_;
      sVar35 = auVar25._10_2_ + auVar28._10_2_;
      sVar36 = auVar25._12_2_ + auVar28._12_2_;
      sVar37 = auVar25._14_2_ + auVar28._14_2_;
      auVar38._0_2_ = sVar29 - auVar20._0_2_;
      auVar38._2_2_ = sVar31 - auVar13._0_2_;
      auVar38._4_2_ = sVar32 - auVar12._0_2_;
      auVar38._6_2_ = sVar33 - sVar26;
      auVar38._8_2_ = sVar34 - auVar8._8_2_;
      auVar38._10_2_ = sVar35 - auVar6._10_2_;
      auVar38._12_2_ = sVar36 - auVar4._12_2_;
      auVar38._14_2_ = sVar37 - uVar9;
      auVar38 = pabsw(auVar38,auVar38);
      auVar30._0_2_ = sVar29 - sVar21;
      auVar30._2_2_ = sVar31 - sVar24;
      auVar30._4_2_ = sVar32 - sVar21;
      auVar30._6_2_ = sVar33 - sVar24;
      auVar30._8_2_ = sVar34 - sVar21;
      auVar30._10_2_ = sVar35 - sVar24;
      auVar30._12_2_ = sVar36 - sVar21;
      auVar30._14_2_ = sVar37 - sVar24;
      auVar30 = pabsw(auVar30,auVar30);
      auVar40._0_2_ = -(ushort)(auVar38._0_2_ < auVar22._0_2_);
      auVar40._2_2_ = -(ushort)(auVar38._2_2_ < auVar22._2_2_);
      auVar40._4_2_ = -(ushort)(auVar38._4_2_ < auVar22._4_2_);
      auVar40._6_2_ = -(ushort)(auVar38._6_2_ < auVar22._6_2_);
      auVar40._8_2_ = -(ushort)(auVar38._8_2_ < auVar22._8_2_);
      auVar40._10_2_ = -(ushort)(auVar38._10_2_ < auVar22._10_2_);
      auVar40._12_2_ = -(ushort)(auVar38._12_2_ < auVar22._12_2_);
      auVar40._14_2_ = -(ushort)(auVar38._14_2_ < auVar22._14_2_);
      auVar41._0_2_ = -(ushort)(auVar30._0_2_ < auVar22._0_2_);
      auVar41._2_2_ = -(ushort)(auVar30._2_2_ < auVar22._2_2_);
      auVar41._4_2_ = -(ushort)(auVar30._4_2_ < auVar22._4_2_);
      auVar41._6_2_ = -(ushort)(auVar30._6_2_ < auVar22._6_2_);
      auVar41._8_2_ = -(ushort)(auVar30._8_2_ < auVar22._8_2_);
      auVar41._10_2_ = -(ushort)(auVar30._10_2_ < auVar22._10_2_);
      auVar41._12_2_ = -(ushort)(auVar30._12_2_ < auVar22._12_2_);
      auVar41._14_2_ = -(ushort)(auVar30._14_2_ < auVar22._14_2_);
      auVar39._0_2_ = -(ushort)(auVar30._0_2_ < auVar38._0_2_);
      auVar39._2_2_ = -(ushort)(auVar30._2_2_ < auVar38._2_2_);
      auVar39._4_2_ = -(ushort)(auVar30._4_2_ < auVar38._4_2_);
      auVar39._6_2_ = -(ushort)(auVar30._6_2_ < auVar38._6_2_);
      auVar39._8_2_ = -(ushort)(auVar30._8_2_ < auVar38._8_2_);
      auVar39._10_2_ = -(ushort)(auVar30._10_2_ < auVar38._10_2_);
      auVar39._12_2_ = -(ushort)(auVar30._12_2_ < auVar38._12_2_);
      auVar39._14_2_ = -(ushort)(auVar30._14_2_ < auVar38._14_2_);
      auVar28 = ~(auVar41 | auVar40) & auVar28 |
                (~auVar39 & auVar20 | auVar23 & auVar39) & (auVar41 | auVar40);
      sVar29 = auVar28._0_2_;
      sVar31 = auVar28._2_2_;
      sVar32 = auVar28._4_2_;
      sVar33 = auVar28._6_2_;
      sVar34 = auVar28._8_2_;
      sVar35 = auVar28._10_2_;
      sVar36 = auVar28._12_2_;
      sVar37 = auVar28._14_2_;
      *(ulong *)dst =
           CONCAT17((0 < sVar37) * (sVar37 < 0x100) * auVar28[0xe] - (0xff < sVar37),
                    CONCAT16((0 < sVar36) * (sVar36 < 0x100) * auVar28[0xc] - (0xff < sVar36),
                             CONCAT15((0 < sVar35) * (sVar35 < 0x100) * auVar28[10] -
                                      (0xff < sVar35),
                                      CONCAT14((0 < sVar34) * (sVar34 < 0x100) * auVar28[8] -
                                               (0xff < sVar34),
                                               CONCAT13((0 < sVar33) * (sVar33 < 0x100) * auVar28[6]
                                                        - (0xff < sVar33),
                                                        CONCAT12((0 < sVar32) * (sVar32 < 0x100) *
                                                                 auVar28[4] - (0xff < sVar32),
                                                                 CONCAT11((0 < sVar31) *
                                                                          (sVar31 < 0x100) *
                                                                          auVar28[2] -
                                                                          (0xff < sVar31),
                                                                          (0 < sVar29) *
                                                                          (sVar29 < 0x100) *
                                                                          auVar28[0] -
                                                                          (0xff < sVar29))))))));
      dst = dst + stride;
      auVar28._0_2_ = auVar27._0_2_ + 1;
      auVar28._2_2_ = auVar27._2_2_ + 1;
      auVar28._4_2_ = auVar27._4_2_ + 1;
      auVar28._6_2_ = auVar27._6_2_ + 1;
      auVar28._8_2_ = auVar27._8_2_ + 1;
      auVar28._10_2_ = auVar27._10_2_ + 1;
      auVar28._12_2_ = auVar27._12_2_ + 1;
      auVar28._14_2_ = auVar27._14_2_ + 1;
      iVar18 = iVar18 + -1;
      auVar27 = auVar28;
    } while (iVar18 != 0);
    bVar19 = lVar17 == 0;
    lVar17 = lVar17 + 1;
  } while (bVar19);
  return;
}

Assistant:

void aom_paeth_predictor_8x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m128i t = _mm_loadl_epi64((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i t16 = _mm_unpacklo_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);

  for (int j = 0; j < 2; ++j) {
    const __m128i l = _mm_load_si128((const __m128i *)(left + j * 16));
    __m128i rep = _mm_set1_epi16((short)0x8000);
    for (int i = 0; i < 16; ++i) {
      const __m128i l16 = _mm_shuffle_epi8(l, rep);
      const __m128i row = paeth_8x1_pred(&l16, &t16, &tl16);

      _mm_storel_epi64((__m128i *)dst, _mm_packus_epi16(row, row));
      dst += stride;
      rep = _mm_add_epi16(rep, one);
    }
  }
}